

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O3

void __thiscall
Lib::
Recycled<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
::~Recycled(Recycled<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            *this)

{
  _Head_base<0UL,_Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher_*,_false> _Var1;
  Stack<std::unique_ptr<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>_>
  *this_00;
  unique_ptr<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>
  *puVar2;
  _Head_base<0UL,_Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher_*,_false> local_20;
  
  _Var1._M_head_impl =
       (this->_self)._M_t.
       super___uniq_ptr_impl<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher_*,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>
       .
       super__Head_base<0UL,_Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher_*,_false>
       ._M_head_impl;
  if (((_Var1._M_head_impl != (TermMatcher *)0x0) &&
      (*(size_t *)((long)&(_Var1._M_head_impl)->super_Matcher + 0x20) != 0)) &&
     (Recycled<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,Lib::DefaultReset,Lib::DefaultKeepRecycled>
      ::memAlive == '\x01')) {
    Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher::reset(_Var1._M_head_impl);
    this_00 = mem();
    _Var1._M_head_impl =
         (this->_self)._M_t.
         super___uniq_ptr_impl<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>
         ._M_t.
         super__Tuple_impl<0UL,_Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher_*,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>
         .
         super__Head_base<0UL,_Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher_*,_false>
         ._M_head_impl;
    (this->_self)._M_t.
    super___uniq_ptr_impl<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>
    ._M_t.
    super__Tuple_impl<0UL,_Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher_*,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>
    .super__Head_base<0UL,_Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher_*,_false>.
    _M_head_impl = (TermMatcher *)0x0;
    puVar2 = this_00->_cursor;
    if (puVar2 == this_00->_end) {
      Stack<std::unique_ptr<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>_>
      ::expand(this_00);
      puVar2 = this_00->_cursor;
    }
    (puVar2->_M_t).
    super___uniq_ptr_impl<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>
    ._M_t.
    super__Tuple_impl<0UL,_Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher_*,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>
    .super__Head_base<0UL,_Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher_*,_false>.
    _M_head_impl = _Var1._M_head_impl;
    local_20._M_head_impl = (TermMatcher *)0x0;
    this_00->_cursor = this_00->_cursor + 1;
    std::
    unique_ptr<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>
    ::~unique_ptr((unique_ptr<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>
                   *)&local_20);
  }
  std::
  unique_ptr<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>
  ::~unique_ptr(&this->_self);
  return;
}

Assistant:

~Recycled()
  {
    if (IF_USE_PTRS(_self, true) && _keep(self()) && memAlive) {
      _reset(self());
      mem().push(std::move(_self));
    }
  }